

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_bid(archive_read *a,wchar_t best_bid)

{
  char *h;
  size_t sVar1;
  void *pvVar2;
  int in_ESI;
  size_t next;
  ssize_t window;
  ssize_t offset;
  ssize_t bytes_avail;
  void *buff;
  char *p;
  size_t in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  archive_read *a_00;
  long local_38;
  long local_30;
  void *local_20;
  wchar_t local_4;
  
  if (in_ESI < 0x1f) {
    h = (char *)__archive_read_ahead
                          (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ssize_t *)0x13c134);
    if (h == (char *)0x0) {
      local_4 = L'\xffffffff';
    }
    else {
      sVar1 = lha_check_header_format(h);
      if (sVar1 == 0) {
        local_4 = L'\x1e';
      }
      else if ((*h == 'M') && (h[1] == 'Z')) {
        local_38 = 0;
        a_00 = (archive_read *)0x1000;
        do {
          while( true ) {
            if (0x4fff < local_38) goto LAB_0013c262;
            pvVar2 = __archive_read_ahead(a_00,in_stack_ffffffffffffffb8,(ssize_t *)0x13c1c6);
            if (pvVar2 == (void *)0x0) break;
            for (local_20 = (void *)((long)pvVar2 + local_38);
                (long)local_20 + 0x16U < (ulong)((long)pvVar2 + local_30);
                local_20 = (void *)(in_stack_ffffffffffffffb8 + (long)local_20)) {
              in_stack_ffffffffffffffb8 = lha_check_header_format(local_20);
              if (in_stack_ffffffffffffffb8 == 0) {
                return L'\x1e';
              }
            }
            local_38 = (long)local_20 - (long)pvVar2;
          }
          a_00 = (archive_read *)((long)a_00 >> 1);
        } while (0x18 < (long)a_00);
        local_4 = L'\0';
      }
      else {
LAB_0013c262:
        local_4 = L'\0';
      }
    }
  }
  else {
    local_4 = L'\xffffffff';
  }
  return local_4;
}

Assistant:

static int
archive_read_format_lha_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	const void *buff;
	ssize_t bytes_avail, offset, window;
	size_t next;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 30)
		return (-1);

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL)
		return (-1);

	if (lha_check_header_format(p) == 0)
		return (30);

	if (p[0] == 'M' && p[1] == 'Z') {
		/* PE file */
		offset = 0;
		window = 4096;
		while (offset < (1024 * 20)) {
			buff = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < (H_SIZE + 3))
					return (0);
				continue;
			}
			p = (const char *)buff + offset;
			while (p + H_SIZE < (const char *)buff + bytes_avail) {
				if ((next = lha_check_header_format(p)) == 0)
					return (30);
				p += next;
			}
			offset = p - (const char *)buff;
		}
	}
	return (0);
}